

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecvt.cpp
# Opt level: O0

locale booster::locale::impl_posix::create_codecvt
                 (locale *in,string *encoding,character_facet_type type)

{
  byte bVar1;
  _Impl *in_RDI;
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  cvt;
  invalid_charset_error *anon_var_0;
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff68;
  character_facet_type type_00;
  undefined7 in_stack_ffffffffffffff88;
  character_facet_type in_stack_ffffffffffffffbc;
  string *in_stack_ffffffffffffffc0;
  locale *in_stack_ffffffffffffffc8;
  
  std::__cxx11::string::c_str();
  type_00 = (character_facet_type)((ulong)&stack0xffffffffffffffc0 >> 0x20);
  conv::impl::normalize_encoding_abi_cxx11_(in_stack_ffffffffffffff68);
  bVar1 = std::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  if ((bVar1 & 1) == 0) {
    util::create_simple_codecvt
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  else {
    util::create_utf8_codecvt((locale *)CONCAT17(bVar1,in_stack_ffffffffffffff88),type_00);
  }
  return (locale)in_RDI;
}

Assistant:

std::locale create_codecvt(std::locale const &in,std::string const &encoding,character_facet_type type)
    {
        if(conv::impl::normalize_encoding(encoding.c_str())=="utf8")
            return util::create_utf8_codecvt(in,type);

        try {
            return util::create_simple_codecvt(in,encoding,type);
        }
        catch(conv::invalid_charset_error const &) {
            std::unique_ptr<util::base_converter> cvt;
            cvt = create_iconv_converter(encoding);
            return util::create_codecvt(in,std::move(cvt),type);
        }
    }